

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter>::destroy
          (AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter> *this)

{
  SignalPromiseAdapter **ppSVar1;
  SignalPromiseAdapter *pSVar2;
  SignalPromiseAdapter ***pppSVar3;
  
  ppSVar1 = (this->adapter).prev;
  if (ppSVar1 != (SignalPromiseAdapter **)0x0) {
    pSVar2 = (this->adapter).next;
    pppSVar3 = &((this->adapter).loop)->signalTail;
    if (pSVar2 != (SignalPromiseAdapter *)0x0) {
      pppSVar3 = &pSVar2->prev;
    }
    *pppSVar3 = ppSVar1;
    *(this->adapter).prev = pSVar2;
  }
  if ((this->result).super_ExceptionOrValue.exception.ptr.isSet == true) {
    Exception::~Exception(&(this->result).super_ExceptionOrValue.exception.ptr.field_1.value);
  }
  AsyncObject::~AsyncObject((AsyncObject *)&this->super_PromiseFulfiller<siginfo_t>);
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }